

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft201909_tests.cpp
# Opt level: O1

void anon_unknown.dwarf_414fdb7::jsonschema_tests(string *fpath,evaluation_options *options)

{
  bool bVar1;
  ostream *poVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *extraout_RDX_01;
  iterator iVar6;
  iterator this;
  array_range_type aVar7;
  const_array_range_type cVar8;
  int count;
  int count_test;
  json_schema<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> compiled;
  size_t errors;
  error_reporter_adaptor adaptor;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> context;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> patch;
  json tests;
  json_pointer instance_location;
  AssertionHandler catchAssertionHandler;
  fstream is;
  int local_4f8;
  int local_4f4;
  long *local_4f0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_4e8;
  long local_4e0;
  SourceLineInfo local_4d8;
  _Any_data local_4c8;
  code *local_4b8;
  string_view_type local_4a8;
  long local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_490;
  undefined4 local_478;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_468;
  iterator local_458;
  evaluation_options *local_450;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_448;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428 [2];
  StringRef local_3f8;
  string_view_type local_3e8;
  evaluation_options local_3d8;
  undefined1 local_388 [8];
  char *pcStack_380;
  undefined1 local_378 [16];
  undefined4 local_368;
  undefined4 uStack_364;
  _Invoker_type local_360;
  undefined1 auStack_358 [8];
  undefined8 local_350;
  IResultCapture *pIStack_348;
  size_t local_340;
  basic_json_options_common<char> local_318;
  undefined1 local_240 [528];
  iterator iVar5;
  
  std::fstream::fstream(local_240,(string *)fpath,_S_out|_S_in);
  if (((byte)(*(_func_int **)(local_240._0_8_ + -0x18))[(long)(local_240 + 0x20)] & 5) == 0) {
    memset((basic_json_options<char> *)local_388,0,0x148);
    ::jsoncons::basic_json_options<char>::basic_json_options((basic_json_options<char> *)local_388);
    ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              (&local_438,(basic_istream<char,_std::char_traits<char>_> *)local_240,
               (basic_json_decode_options<char> *)local_388);
    ::jsoncons::basic_json_encode_options<char>::~basic_json_encode_options
              ((basic_json_encode_options<char> *)auStack_358,&PTR_construction_vtable_24__00b58fe8)
    ;
    local_388 = (undefined1  [8])&PTR__basic_json_decode_options_00b59020;
    local_318._vptr_basic_json_options_common =
         (_func_int **)&PTR__basic_json_decode_options_00b59048;
    if ((code *)CONCAT44(uStack_364,local_368) != (code *)0x0) {
      (*(code *)CONCAT44(uStack_364,local_368))(local_378,local_378,3);
    }
    local_450 = options;
    ::jsoncons::basic_json_options_common<char>::~basic_json_options_common(&local_318);
    local_4f8 = 0;
    aVar7 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            array_range(&local_438);
    local_458 = aVar7.last_._M_current;
    if (aVar7.first_._M_current._M_current != local_458._M_current) {
      do {
        local_458 = aVar7.last_._M_current;
        local_4e8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    aVar7.first_._M_current;
        local_4f8 = local_4f8 + 1;
        local_388 = (undefined1  [8])&DAT_00000006;
        pcStack_380 = "schema";
        pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           (local_4e8,(string_view_type *)local_388);
        ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        uninitialized_copy(&local_448,pbVar3);
        ::jsoncons::jsonschema::evaluation_options::evaluation_options(&local_3d8,local_450);
        ::jsoncons::jsonschema::
        make_json_schema<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>
                  ((jsonschema *)&local_4f0,&local_448,resolver,&local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.default_base_uri_._M_dataplus._M_p != &local_3d8.default_base_uri_.field_2)
        {
          operator_delete(local_3d8.default_base_uri_._M_dataplus._M_p,
                          local_3d8.default_base_uri_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.default_version_._M_dataplus._M_p != &local_3d8.default_version_.field_2) {
          operator_delete(local_3d8.default_version_._M_dataplus._M_p,
                          local_3d8.default_version_.field_2._M_allocated_capacity + 1);
        }
        ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                  (&local_448);
        local_4f4 = 0;
        local_388 = (undefined1  [8])&DAT_00000005;
        pcStack_380 = "tests";
        pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[](local_4e8,(string_view_type *)local_388);
        cVar8 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                array_range(pbVar3);
        iVar5 = cVar8.last_._M_current;
        while (this = cVar8.first_._M_current, this._M_current != iVar5._M_current) {
          local_4f4 = local_4f4 + 1;
          local_4e0 = 0;
          local_3e8._M_len = 4;
          local_3e8._M_str = "data";
          pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             (this._M_current,&local_3e8);
          local_428[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_428[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_428[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_468.long_str_.ptr_ = (pointer)operator_new(0x20);
          *(undefined8 *)
           &(((pointer)local_468.long_str_.ptr_)->
            super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
          ((pointer)local_468.long_str_.ptr_)->p_ = (pointer)0x0;
          (local_468.byte_str_.ptr_)->length_ = 0;
          local_468.common_ = (common_storage)0xe;
          local_378._0_8_ = (void *)0x0;
          local_378._8_8_ = 0;
          local_388 = (undefined1  [8])0x0;
          pcStack_380 = (char *)0x0;
          local_388 = (undefined1  [8])operator_new(0x28);
          *(long **)local_388 = &local_4e0;
          *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
           ((long)local_388 + 8) = this._M_current;
          *(string **)((long)local_388 + 0x10) = fpath;
          *(int **)((long)local_388 + 0x18) = &local_4f8;
          *(int **)((long)local_388 + 0x20) = &local_4f4;
          local_378._8_8_ =
               std::
               _Function_handler<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp:64:37)>
               ::_M_invoke;
          local_378._0_8_ =
               std::
               _Function_handler<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp:64:37)>
               ::_M_manager;
          local_4d8.line = 0;
          local_4d8.file = (char *)&PTR__error_reporter_adaptor_00b6b5e8;
          std::
          function<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&)>
          ::function((function<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&)>
                      *)&local_4c8,
                     (function<jsoncons::jsonschema::walk_result_(const_jsoncons::jsonschema::validation_message_&)>
                      *)local_388);
          if ((code *)local_378._0_8_ != (code *)0x0) {
            (*(code *)local_378._0_8_)
                      ((AssertionHandler *)local_388,(AssertionHandler *)local_388,3);
          }
          vStack_490.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_490.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_498 = 0;
          vStack_490.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_4a8._M_len = 0;
          local_4a8._M_str = (char *)0x0;
          local_478 = 0;
          local_388 = (undefined1  [8])auStack_358;
          pcStack_380 = (char *)0x1;
          local_378._0_8_ = (void *)0x0;
          local_378._8_8_ = 0;
          local_368 = 0x3f800000;
          local_350 = (void *)0x0;
          pIStack_348 = (IResultCapture *)0x0;
          local_360 = (_Invoker_type)0x0;
          auStack_358 = (undefined1  [8])0x0;
          local_340 = 0;
          (**(code **)(*local_4f0 + 0x28))
                    (local_4f0,&local_4a8,pbVar3,local_428,(AssertionHandler *)local_388,&local_4d8,
                     &local_468);
          if (local_350 != (void *)0x0) {
            operator_delete(local_350,local_340 - (long)local_350);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_388);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_490);
          if ((undefined1 *)local_4a8._M_len != (undefined1 *)0x0) {
            operator_delete((void *)local_4a8._M_len,local_498 - local_4a8._M_len);
          }
          local_4d8.file = (char *)&PTR__error_reporter_adaptor_00b6b5e8;
          if (local_4b8 != (code *)0x0) {
            (*local_4b8)(&local_4c8,&local_4c8,__destroy_functor);
          }
          ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     &local_468.common_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(local_428);
          iVar6._M_current = extraout_RDX;
          if (local_4e0 == 0) {
            local_4a8._M_len = 0x8102c5;
            local_4a8._M_str = &DAT_00000005;
            local_4d8.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp"
            ;
            local_4d8.line = 0x53;
            Catch::StringRef::StringRef(&local_3f8,"test_case[\"valid\"].as<bool>()");
            Catch::AssertionHandler::AssertionHandler
                      ((AssertionHandler *)local_388,(StringRef *)&local_4a8,&local_4d8,local_3f8,
                       ContinueOnFailure);
            local_4a8._M_len = (size_t)&DAT_00000005;
            local_4a8._M_str = "valid";
            pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this._M_current,&local_4a8);
            bVar1 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_bool(pbVar3);
            local_4d8.file = (char *)CONCAT71(local_4d8.file._1_7_,bVar1);
            Catch::AssertionHandler::handleExpr<bool>
                      ((AssertionHandler *)local_388,(ExprLhs<bool> *)&local_4d8);
            Catch::AssertionHandler::complete((AssertionHandler *)local_388);
            if (local_350._2_1_ == false) {
              (*pIStack_348->_vptr_IResultCapture[0xe])(pIStack_348,(AssertionHandler *)local_388);
            }
            local_388 = (undefined1  [8])&DAT_00000005;
            pcStack_380 = "valid";
            pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     operator[](this._M_current,(string_view_type *)local_388);
            bVar1 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    as_bool(pbVar3);
            iVar6._M_current = extraout_RDX_00;
            if (!bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  File: ",8)
              ;
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(fpath->_M_dataplus)._M_p,
                                  fpath->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  Test case ",0xc);
              poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_4f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
              poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_4f4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
              local_388 = (undefined1  [8])&DAT_0000000b;
              pcStack_380 = "description";
              pbVar3 = ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                       ::operator[](this._M_current,(string_view_type *)local_388);
              pbVar4 = ::jsoncons::operator<<(poVar2,pbVar3);
              std::__ostream_insert<char,std::char_traits<char>>(pbVar4,"\n",1);
              iVar6._M_current = extraout_RDX_01;
            }
          }
          cVar8.last_._M_current = iVar6._M_current;
          cVar8.first_._M_current = this._M_current + 1;
        }
        if (local_4f0 != (long *)0x0) {
          (**(code **)(*local_4f0 + 8))();
        }
        aVar7.last_._M_current = local_458._M_current;
        aVar7.first_._M_current = local_4e8 + 1;
      } while (local_4e8 + 1 != local_458._M_current);
    }
    ::jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              (&local_438);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot open file: ",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fpath->_M_dataplus)._M_p,fpath->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void jsonschema_tests(const std::string& fpath,
        jsonschema::evaluation_options options = jsonschema::evaluation_options{}.default_version(jsonschema::schema_version::draft201909()))
    {
        std::fstream is(fpath);
        if (!is)
        {
            std::cout << "Cannot open file: " << fpath << "\n";
            return;
        }

        json tests = json::parse(is); 
        //std::cout << pretty_print(tests) << "\n";

        int count = 0;
        for (const auto& test_group : tests.array_range()) 
        {
            ++count;
            try
            {
                jsonschema::json_schema<json> compiled = jsonschema::make_json_schema(test_group.at("schema"), resolver, 
                    options);

                int count_test = 0;
                for (const auto& test_case : test_group["tests"].array_range()) 
                {
                    //std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                    ++count_test;
                    std::size_t errors = 0;
                    auto reporter = [&](const jsonschema::validation_message& msg) -> jsonschema::walk_result
                    {
                        ++errors;
                        CHECK_FALSE(test_case["valid"].as<bool>());
                        if (test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                            std::cout << "  Failed: " << msg.instance_location().string() << ": " << msg.message() << "\n";
                            for (const auto& err : msg.details())
                            {
                                std::cout << "  Nested error: " << err.instance_location().string() << ": " << err.message() << "\n";
                            }
                        }
                        return jsonschema::walk_result::advance;
                    };
                    compiled.validate(test_case.at("data"), reporter);
                    if (errors == 0)
                    {
                        CHECK(test_case["valid"].as<bool>());
                        if (!test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                        }
                    }
                }
            }
            catch (const std::exception& e)
            {
                std::cout << "  File: " << fpath << " " << count << "\n";
                std::cout << e.what() << "\n\n";
                CHECK(false);
            }
        }
    }